

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O3

void __thiscall t_program::add_include(t_program *this,string *path,string *include_site)

{
  pointer *ppptVar1;
  pointer pcVar2;
  iterator __position;
  t_program *this_00;
  long lVar3;
  t_program *program;
  string include_prefix;
  t_program *local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = (t_program *)operator_new(0x238);
  pcVar2 = (path->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + path->_M_string_length);
  t_program(this_00,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_a0 = 0;
  local_98[0] = 0;
  local_b0 = this_00;
  local_a8 = local_98;
  lVar3 = std::__cxx11::string::rfind((char *)include_site,0x378461,0xffffffffffffffff);
  if (lVar3 != -1) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)include_site);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a8 + local_a0);
  set_include_prefix(this_00,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  __position._M_current =
       (this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<t_program*,std::allocator<t_program*>>::_M_realloc_insert<t_program*const&>
              ((vector<t_program*,std::allocator<t_program*>> *)&this->includes_,__position,
               &local_b0);
  }
  else {
    *__position._M_current = this_00;
    ppptVar1 = &(this->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

void add_include(std::string path, std::string include_site) {
    t_program* program = new t_program(path);

    // include prefix for this program is the site at which it was included
    // (minus the filename)
    std::string include_prefix;
    std::string::size_type last_slash = std::string::npos;
    if ((last_slash = include_site.rfind("/")) != std::string::npos) {
      include_prefix = include_site.substr(0, last_slash);
    }

    program->set_include_prefix(include_prefix);
    includes_.push_back(program);
  }